

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_unvoiced_vowel.c
# Opt level: O2

void get_mora_information
               (NJDNode *node,int index,char **mora,NJDNode **nlink,int *flag,int *size,int *midx,
               int *atype)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  while( true ) {
    __s = NJDNode_get_pron(node);
    sVar2 = strlen(__s);
    if (index < (int)sVar2) break;
    node = node->next;
    index = index - (int)sVar2;
    if (node == (_NJDNode *)0x0) {
      *mora = (char *)0x0;
      *nlink = (NJDNode *)0x0;
      *flag = -1;
      *size = 0;
      *midx = 0;
      *atype = 0;
      return;
    }
  }
  *nlink = node;
  if ((index == 0) && (iVar1 = NJDNode_get_chain_flag(node), iVar1 != 1)) {
    *midx = 0;
    iVar1 = NJDNode_get_acc(node);
    *atype = iVar1;
  }
  pcVar4 = anon_var_dwarf_247c;
  iVar1 = strcmp(__s,anon_var_dwarf_247c);
  if (iVar1 != 0) {
    pcVar4 = anon_var_dwarf_1cb2;
    iVar1 = strcmp(__s,anon_var_dwarf_1cb2);
    if (iVar1 != 0) {
      *mora = (char *)0x0;
      *flag = -1;
      *size = 0;
      lVar3 = 0;
      do {
        if (lVar3 == 0x4f8) {
          iVar1 = 0;
          goto LAB_001427de;
        }
        pcVar4 = *(char **)((long)njd_set_unvoiced_vowel_mora_list + lVar3);
        iVar1 = strtopcmp(__s + index,pcVar4);
        lVar3 = lVar3 + 8;
      } while (iVar1 < 1);
      *mora = pcVar4;
      *size = iVar1;
LAB_001427de:
      iVar1 = strtopcmp(__s + (iVar1 + index),anon_var_dwarf_1ad2);
      if (0 < iVar1) {
        *flag = 1;
        *size = *size + iVar1;
      }
      return;
    }
  }
  *mora = pcVar4;
  *flag = 0;
  *size = 3;
  return;
}

Assistant:

static void get_mora_information(NJDNode * node, int index, const char **mora, NJDNode ** nlink,
                                 int *flag, int *size, int *midx, int *atype)
{
   int i;
   int matched_size;
   const char *str = NJDNode_get_pron(node);
   int len = strlen(str);

   /* find next word */
   if (index >= len) {
      if (node->next != NULL) {
         get_mora_information(node->next, index - len, mora, nlink, flag, size, midx, atype);
      } else {
         *mora = NULL;
         *nlink = NULL;
         *flag = -1;
         *size = 0;
         *midx = 0;
         *atype = 0;
      }
      return;
   }

   *nlink = node;

   /* reset mora index and accent type for new word */
   if (index == 0 && NJDNode_get_chain_flag(node) != 1) {
      *midx = 0;
      *atype = NJDNode_get_acc(node);
   }

   /* special symbol */
   if (strcmp(str, NJD_SET_UNVOICED_VOWEL_TOUTEN) == 0) {
      *mora = NJD_SET_UNVOICED_VOWEL_TOUTEN;
      *flag = 0;
      *size = strlen(NJD_SET_UNVOICED_VOWEL_TOUTEN);
      return;
   }
   if (strcmp(str, NJD_SET_UNVOICED_VOWEL_QUESTION) == 0) {
      *mora = NJD_SET_UNVOICED_VOWEL_QUESTION;
      *flag = 0;
      *size = strlen(NJD_SET_UNVOICED_VOWEL_QUESTION);
      return;
   }

   /* reset */
   *mora = NULL;
   *flag = -1;
   *size = 0;

   /* get mora */
   for (i = 0; njd_set_unvoiced_vowel_mora_list[i] != NULL; i++) {
      matched_size = strtopcmp(&str[index], njd_set_unvoiced_vowel_mora_list[i]);
      if (matched_size > 0) {
         *mora = njd_set_unvoiced_vowel_mora_list[i];
         *size = matched_size;
         break;
      }
   }

   /* get unvoice flag */
   matched_size = strtopcmp(&str[index + (*size)], NJD_SET_UNVOICED_VOWEL_QUOTATION);
   if (matched_size > 0) {
      *flag = 1;
      *size += matched_size;
   }
}